

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

void set_alloca_based_flag(bb_insn_t_conflict bb_insn,int must_p)

{
  MIR_insn_t pMVar1;
  void *pvVar2;
  MIR_item_t pMVar3;
  
  pMVar1 = bb_insn->insn;
  if (*(ulong *)&pMVar1->field_0x18 >> 0x21 != 0) {
    pvVar2 = pMVar1[1].data;
    if ((must_p != 0) &&
       (((pvVar2 != (void *)0x0 && ((*(byte *)(*(long *)((long)pvVar2 + 8) + 9) & 2) != 0)) ||
        (((*(ulong *)&pMVar1->field_0x18 & 0xffffffff00000000) == 0x300000000 &&
         ((pMVar3 = pMVar1[1].ops[0].u.ref, pMVar3 != (MIR_item_t)0x0 &&
          (((ulong)pMVar3->module->name & 0x200) != 0)))))))) {
      bb_insn->alloca_flag = bb_insn->alloca_flag | 2;
    }
    if (((pvVar2 != (void *)0x0) && ((*(byte *)(*(long *)((long)pvVar2 + 8) + 9) & 1) != 0)) ||
       (((*(ulong *)&pMVar1->field_0x18 & 0xffffffff00000000) == 0x300000000 &&
        ((pMVar3 = pMVar1[1].ops[0].u.ref, pMVar3 != (MIR_item_t)0x0 &&
         (((ulong)pMVar3->module->name & 0x100) != 0)))))) {
      bb_insn->alloca_flag = bb_insn->alloca_flag | 1;
    }
    return;
  }
  __assert_fail("insn->nops >= 2",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0xfed,"void set_alloca_based_flag(bb_insn_t, int)");
}

Assistant:

static void set_alloca_based_flag (bb_insn_t bb_insn, int must_p) {
  MIR_insn_t insn = bb_insn->insn;
  ssa_edge_t se;

  gen_assert (insn->nops >= 2);
  if (must_p) {
    if (((se = insn->ops[1].data) != NULL && (se->def->alloca_flag & MUST_ALLOCA))
        || (insn->nops == 3 && (se = insn->ops[2].data) != NULL
            && (se->def->alloca_flag & MUST_ALLOCA)))
      bb_insn->alloca_flag |= MUST_ALLOCA;
  }
  if (((se = insn->ops[1].data) != NULL && (se->def->alloca_flag & MAY_ALLOCA))
      || (insn->nops == 3 && (se = insn->ops[2].data) != NULL
          && (se->def->alloca_flag & MAY_ALLOCA)))
    bb_insn->alloca_flag |= MAY_ALLOCA;
}